

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_helper.c
# Opt level: O0

void arm_debug_excp_handler_aarch64(CPUState *cs)

{
  uint uVar1;
  CPUWatchpoint *pCVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  CPUARMState_conflict *env_00;
  TranslationBlock *local_58;
  _Bool same_el_1;
  uint64_t pc;
  _Bool same_el;
  _Bool wnr;
  CPUWatchpoint *wp_hit;
  CPUARMState_conflict *env;
  ARMCPU_conflict1 *cpu;
  CPUState *cs_local;
  
  env_00 = (CPUARMState_conflict *)(cs[1].tb_jmp_cache + 0x40b);
  pCVar2 = cs->watchpoint_hit;
  if (pCVar2 == (CPUWatchpoint *)0x0) {
    _Var3 = is_a64(env_00);
    if (_Var3) {
      local_58 = cs[1].tb_jmp_cache[0x433];
    }
    else {
      local_58 = (TranslationBlock *)(ulong)*(uint *)((long)cs[1].tb_jmp_cache + 0x2094);
    }
    iVar4 = arm_debug_target_el(env_00);
    iVar5 = arm_current_el(env_00);
    _Var3 = cpu_breakpoint_test(cs,(vaddr)local_58,0x10);
    if ((!_Var3) && (_Var3 = cpu_breakpoint_test(cs,(vaddr)local_58,0x20), _Var3)) {
      uVar6 = arm_debug_exception_fsr(env_00);
      *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
      cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)0x0;
      uVar6 = syn_breakpoint((uint)(iVar4 == iVar5));
      uVar7 = arm_debug_target_el(env_00);
      raise_exception_aarch64(env_00,3,uVar6,uVar7);
    }
  }
  else if ((pCVar2->flags & 0x20U) != 0) {
    uVar1 = pCVar2->flags;
    iVar4 = arm_debug_target_el(env_00);
    iVar5 = arm_current_el(env_00);
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    uVar6 = arm_debug_exception_fsr(env_00);
    *(uint32_t *)((long)cs[1].tb_jmp_cache + 0x2c2c) = uVar6;
    cs[1].tb_jmp_cache[0x586] = (TranslationBlock *)pCVar2->hitaddr;
    uVar6 = syn_watchpoint((uint)(iVar4 == iVar5),0,(uint)((uVar1 & 0x80) != 0));
    uVar7 = arm_debug_target_el(env_00);
    raise_exception_aarch64(env_00,4,uVar6,uVar7);
  }
  return;
}

Assistant:

void arm_debug_excp_handler(CPUState *cs)
{
    /*
     * Called by core code when a watchpoint or breakpoint fires;
     * need to check which one and raise the appropriate exception.
     */
    ARMCPU *cpu = ARM_CPU(cs);
    CPUARMState *env = &cpu->env;
    CPUWatchpoint *wp_hit = cs->watchpoint_hit;

    if (wp_hit) {
        if (wp_hit->flags & BP_CPU) {
            bool wnr = (wp_hit->flags & BP_WATCHPOINT_HIT_WRITE) != 0;
            bool same_el = arm_debug_target_el(env) == arm_current_el(env);

            cs->watchpoint_hit = NULL;

            env->exception.fsr = arm_debug_exception_fsr(env);
            env->exception.vaddress = wp_hit->hitaddr;
            raise_exception(env, EXCP_DATA_ABORT,
                    syn_watchpoint(same_el, 0, wnr),
                    arm_debug_target_el(env));
        }
    } else {
        uint64_t pc = is_a64(env) ? env->pc : env->regs[15];
        bool same_el = (arm_debug_target_el(env) == arm_current_el(env));

        /*
         * (1) GDB breakpoints should be handled first.
         * (2) Do not raise a CPU exception if no CPU breakpoint has fired,
         * since singlestep is also done by generating a debug internal
         * exception.
         */
        if (cpu_breakpoint_test(cs, pc, BP_GDB)
            || !cpu_breakpoint_test(cs, pc, BP_CPU)) {
            return;
        }

        env->exception.fsr = arm_debug_exception_fsr(env);
        /*
         * FAR is UNKNOWN: clear vaddress to avoid potentially exposing
         * values to the guest that it shouldn't be able to see at its
         * exception/security level.
         */
        env->exception.vaddress = 0;
        raise_exception(env, EXCP_PREFETCH_ABORT,
                        syn_breakpoint(same_el),
                        arm_debug_target_el(env));
    }
}